

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeColSingletonPS::execute
          (FreeColSingletonPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  uint *puVar1;
  uint *puVar2;
  int iVar3;
  fpclass_type fVar4;
  pointer pnVar5;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar6;
  undefined8 uVar7;
  int32_t iVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int32_t iVar12;
  int iVar13;
  cpp_dec_float<50U,_int,_void> *pcVar14;
  cpp_dec_float<50U,_int,_void> *pcVar15;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar16;
  long lVar17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  cpp_dec_float<50U,_int,_void> local_248;
  cpp_dec_float<50U,_int,_void> local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1c8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1c0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1b8;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_1b0;
  cpp_dec_float<50U,_int,_void> local_1a8;
  cpp_dec_float<50U,_int,_void> local_168;
  uint local_128 [2];
  uint auStack_120 [2];
  uint local_118 [2];
  uint auStack_110 [2];
  uint local_108 [4];
  fpclass_type local_f8;
  int32_t iStack_f4;
  undefined8 uStack_f0;
  cpp_dec_float<50U,_int,_void> local_e0;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  iVar13 = this->m_i;
  iVar3 = this->m_old_i;
  if (iVar13 != iVar3) {
    pnVar5 = (s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 8);
    uVar7 = *(undefined8 *)&pnVar5[iVar13].m_backend.data;
    uVar10 = *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 2);
    puVar1 = pnVar5[iVar13].m_backend.data._M_elems + 4;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar11;
    *(undefined8 *)&pnVar5[iVar3].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2) = uVar10;
    pnVar5[iVar3].m_backend.exp = pnVar5[iVar13].m_backend.exp;
    pnVar5[iVar3].m_backend.neg = pnVar5[iVar13].m_backend.neg;
    iVar12 = pnVar5[iVar13].m_backend.prec_elem;
    pnVar5[iVar3].m_backend.fpclass = pnVar5[iVar13].m_backend.fpclass;
    pnVar5[iVar3].m_backend.prec_elem = iVar12;
    iVar13 = this->m_i;
    pnVar5 = (y->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = this->m_old_i;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 8);
    uVar7 = *(undefined8 *)&pnVar5[iVar13].m_backend.data;
    uVar10 = *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 2);
    puVar1 = pnVar5[iVar13].m_backend.data._M_elems + 4;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar11;
    *(undefined8 *)&pnVar5[iVar3].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2) = uVar10;
    pnVar5[iVar3].m_backend.exp = pnVar5[iVar13].m_backend.exp;
    pnVar5[iVar3].m_backend.neg = pnVar5[iVar13].m_backend.neg;
    iVar12 = pnVar5[iVar13].m_backend.prec_elem;
    pnVar5[iVar3].m_backend.fpclass = pnVar5[iVar13].m_backend.fpclass;
    pnVar5[iVar3].m_backend.prec_elem = iVar12;
    rStatus->data[this->m_old_i] = rStatus->data[this->m_i];
  }
  iVar13 = this->m_j;
  iVar3 = this->m_old_j;
  if (iVar13 != iVar3) {
    pnVar5 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 8);
    uVar7 = *(undefined8 *)&pnVar5[iVar13].m_backend.data;
    uVar10 = *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 2);
    puVar1 = pnVar5[iVar13].m_backend.data._M_elems + 4;
    uVar11 = *(undefined8 *)(puVar1 + 2);
    puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar11;
    *(undefined8 *)&pnVar5[iVar3].m_backend.data = uVar7;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2) = uVar10;
    pnVar5[iVar3].m_backend.exp = pnVar5[iVar13].m_backend.exp;
    pnVar5[iVar3].m_backend.neg = pnVar5[iVar13].m_backend.neg;
    iVar12 = pnVar5[iVar13].m_backend.prec_elem;
    pnVar5[iVar3].m_backend.fpclass = pnVar5[iVar13].m_backend.fpclass;
    pnVar5[iVar3].m_backend.prec_elem = iVar12;
    iVar13 = this->m_j;
    pnVar5 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar3 = this->m_old_j;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 8);
    uVar10 = *(undefined8 *)&pnVar5[iVar13].m_backend.data;
    uVar11 = *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 2);
    puVar1 = pnVar5[iVar13].m_backend.data._M_elems + 4;
    uVar7 = *(undefined8 *)(puVar1 + 2);
    puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar1;
    *(undefined8 *)(puVar2 + 2) = uVar7;
    *(undefined8 *)&pnVar5[iVar3].m_backend.data = uVar10;
    *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2) = uVar11;
    pnVar5[iVar3].m_backend.exp = pnVar5[iVar13].m_backend.exp;
    pnVar5[iVar3].m_backend.neg = pnVar5[iVar13].m_backend.neg;
    iVar12 = pnVar5[iVar13].m_backend.prec_elem;
    pnVar5[iVar3].m_backend.fpclass = pnVar5[iVar13].m_backend.fpclass;
    pnVar5[iVar3].m_backend.prec_elem = iVar12;
    cStatus->data[this->m_old_j] = cStatus->data[this->m_j];
  }
  local_168.fpclass = cpp_dec_float_finite;
  local_168.prec_elem = 10;
  local_168.data._M_elems[0] = 0;
  local_168.data._M_elems[1] = 0;
  local_168.data._M_elems[2] = 0;
  local_168.data._M_elems[3] = 0;
  local_168.data._M_elems[4] = 0;
  local_168.data._M_elems[5] = 0;
  local_168.data._M_elems._24_5_ = 0;
  local_168.data._M_elems[7]._1_3_ = 0;
  local_168.data._M_elems._32_5_ = 0;
  local_168.data._M_elems[9]._1_3_ = 0;
  local_168.exp = 0;
  local_168.neg = false;
  local_1c8 = s;
  local_1c0 = y;
  local_1b8 = r;
  local_1b0 = cStatus;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_168,0.0);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_68,
               &(this->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,this->m_j);
  if (0 < (this->m_row).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar16 = 0;
    lVar17 = 0;
    do {
      pNVar6 = (this->m_row).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      if (*(int *)((long)(&pNVar6->val + 1) + lVar16) != this->m_j) {
        pcVar14 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)(pNVar6->val).m_backend.data._M_elems + lVar16);
        pcVar15 = &(x->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start
                   [*(int *)((long)(&pNVar6->val + 1) + lVar16)].m_backend;
        local_248.fpclass = cpp_dec_float_finite;
        local_248.prec_elem = 10;
        local_248.data._M_elems[0] = 0;
        local_248.data._M_elems[1] = 0;
        local_248.data._M_elems[2] = 0;
        local_248.data._M_elems[3] = 0;
        local_248.data._M_elems[4] = 0;
        local_248.data._M_elems[5] = 0;
        local_248.data._M_elems._24_5_ = 0;
        local_248.data._M_elems[7]._1_3_ = 0;
        local_248.data._M_elems._32_5_ = 0;
        local_248.data._M_elems[9]._1_3_ = 0;
        local_248.exp = 0;
        local_248.neg = false;
        v = pcVar14;
        if ((&local_248 != pcVar15) && (v = pcVar15, pcVar14 != &local_248)) {
          uVar7 = *(undefined8 *)((pcVar14->data)._M_elems + 8);
          local_248.data._M_elems._32_5_ = SUB85(uVar7,0);
          local_248.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
          local_248.data._M_elems._0_8_ = *(undefined8 *)(pcVar14->data)._M_elems;
          local_248.data._M_elems._8_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 2);
          local_248.data._M_elems._16_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 4);
          uVar7 = *(undefined8 *)((pcVar14->data)._M_elems + 6);
          local_248.data._M_elems._24_5_ = SUB85(uVar7,0);
          local_248.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
          local_248.exp = *(int *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar16);
          local_248.neg = *(bool *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar16 + 4);
          local_248._48_8_ = *(undefined8 *)((long)(&(pNVar6->val).m_backend.data + 1) + lVar16 + 8)
          ;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_248,v);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&local_168,&local_248);
      }
      lVar17 = lVar17 + 1;
      lVar16 = lVar16 + 0x3c;
    } while (lVar17 < (this->m_row).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  uVar7 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 8);
  local_248.data._M_elems._32_5_ = SUB85(uVar7,0);
  local_248.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
  uVar7 = *(undefined8 *)(this->m_lRhs).m_backend.data._M_elems;
  uVar10 = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 6);
  local_248.data._M_elems._16_8_ = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 4);
  local_248.data._M_elems._24_5_ = SUB85(uVar10,0);
  local_248.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
  local_248.data._M_elems[0] = (uint)uVar7;
  local_248.data._M_elems[1] = SUB84(uVar7,4);
  uVar10 = local_248.data._M_elems._0_8_;
  local_248.data._M_elems._8_8_ = *(undefined8 *)((this->m_lRhs).m_backend.data._M_elems + 2);
  local_248.neg = (this->m_lRhs).m_backend.neg;
  local_248.exp = (this->m_lRhs).m_backend.exp;
  fVar4 = (this->m_lRhs).m_backend.fpclass;
  iVar8 = (this->m_lRhs).m_backend.prec_elem;
  local_248.fpclass = fVar4;
  local_248.prec_elem = iVar8;
  if ((local_248.neg == true) &&
     (local_248.data._M_elems[0] = (uint)uVar7,
     local_248.data._M_elems[0] != 0 || fVar4 != cpp_dec_float_finite)) {
    local_248.neg = false;
  }
  uVar11._5_3_ = local_168.data._M_elems[9]._1_3_;
  uVar11._0_5_ = local_168.data._M_elems._32_5_;
  local_208.data._M_elems[8] = local_168.data._M_elems[8];
  local_208.data._M_elems[9] = SUB84(uVar11,4);
  uVar7._5_3_ = local_168.data._M_elems[7]._1_3_;
  uVar7._0_5_ = local_168.data._M_elems._24_5_;
  local_208.data._M_elems[4] = local_168.data._M_elems[4];
  local_208.data._M_elems[5] = local_168.data._M_elems[5];
  local_208.data._M_elems[6] = local_168.data._M_elems[6];
  local_208.data._M_elems[7] = SUB84(uVar7,4);
  local_208.data._M_elems[0] = local_168.data._M_elems[0];
  local_208.data._M_elems[1] = local_168.data._M_elems[1];
  uVar7 = local_208.data._M_elems._0_8_;
  local_208.data._M_elems[2] = local_168.data._M_elems[2];
  local_208.data._M_elems[3] = local_168.data._M_elems[3];
  local_208.exp = local_168.exp;
  local_208.neg = local_168.neg;
  local_208.fpclass = local_168.fpclass;
  local_208.prec_elem = local_168.prec_elem;
  if ((local_168.neg != false) &&
     (local_208.data._M_elems[0] = local_168.data._M_elems[0],
     local_208.data._M_elems[0] != 0 || local_168.fpclass != cpp_dec_float_finite)) {
    local_208.neg = (bool)(local_168.neg ^ 1);
  }
  local_208.data._M_elems._0_8_ = uVar7;
  if (local_168.fpclass == cpp_dec_float_NaN || fVar4 == cpp_dec_float_NaN) {
    bVar9 = false;
  }
  else {
    local_248.data._M_elems._0_8_ = uVar10;
    iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_248,&local_208);
    bVar9 = 0 < iVar13;
  }
  pcVar14 = &local_208;
  if (bVar9) {
    pcVar14 = &local_248;
  }
  local_1a8.data._M_elems._32_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 8);
  local_1a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar14->data)._M_elems;
  local_1a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 2);
  local_1a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 4);
  local_1a8.data._M_elems._24_8_ = *(undefined8 *)((pcVar14->data)._M_elems + 6);
  pcVar14 = &local_208;
  if (bVar9) {
    pcVar14 = &local_248;
  }
  local_1a8.exp = pcVar14->exp;
  pcVar14 = &local_208;
  if (bVar9) {
    pcVar14 = &local_248;
  }
  local_1a8.neg = pcVar14->neg;
  pcVar14 = &local_208;
  if (bVar9) {
    pcVar14 = &local_248;
  }
  local_1a8.fpclass = pcVar14->fpclass;
  pcVar14 = &local_208;
  if (bVar9) {
    pcVar14 = &local_248;
  }
  local_1a8.prec_elem = pcVar14->prec_elem;
  if (local_1a8.fpclass != cpp_dec_float_NaN) {
    local_248.fpclass = cpp_dec_float_finite;
    local_248.prec_elem = 10;
    local_248.data._M_elems[0] = 0;
    local_248.data._M_elems[1] = 0;
    local_248.data._M_elems[2] = 0;
    local_248.data._M_elems[3] = 0;
    local_248.data._M_elems[4] = 0;
    local_248.data._M_elems[5] = 0;
    local_248.data._M_elems._24_5_ = 0;
    local_248.data._M_elems[7]._1_3_ = 0;
    local_248.data._M_elems._32_5_ = 0;
    local_248.data._M_elems[9]._1_3_ = 0;
    local_248.exp = 0;
    local_248.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_248,1.0);
    iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_1a8,&local_248);
    if (iVar13 < 0) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_1a8,1.0);
    }
  }
  local_248.fpclass = cpp_dec_float_finite;
  local_248.prec_elem = 10;
  local_248.data._M_elems[0] = 0;
  local_248.data._M_elems[1] = 0;
  local_248.data._M_elems[2] = 0;
  local_248.data._M_elems[3] = 0;
  local_248.data._M_elems[4] = 0;
  local_248.data._M_elems[5] = 0;
  local_248.data._M_elems._24_5_ = 0;
  local_248.data._M_elems[7]._1_3_ = 0;
  local_248.data._M_elems._32_5_ = 0;
  local_248.data._M_elems[9]._1_3_ = 0;
  local_248.exp = 0;
  local_248.neg = false;
  local_1d0 = &this->m_lRhs;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_248,&(this->m_lRhs).m_backend,&local_1a8);
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 10;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems._24_5_ = 0;
  local_a8.data._M_elems[7]._1_3_ = 0;
  local_a8.data._M_elems._32_5_ = 0;
  local_a8.data._M_elems[9]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_a8,&local_168,&local_1a8);
  local_208.data._M_elems[7]._1_3_ = local_248.data._M_elems[7]._1_3_;
  local_208.data._M_elems._24_5_ = local_248.data._M_elems._24_5_;
  local_208.data._M_elems[0] = local_248.data._M_elems[0];
  local_208.data._M_elems[1] = local_248.data._M_elems[1];
  local_208.data._M_elems[2] = local_248.data._M_elems[2];
  local_208.data._M_elems[3] = local_248.data._M_elems[3];
  local_208.data._M_elems[4] = local_248.data._M_elems[4];
  local_208.data._M_elems[5] = local_248.data._M_elems[5];
  local_208.data._M_elems[9]._1_3_ = local_248.data._M_elems[9]._1_3_;
  local_208.data._M_elems._32_5_ = local_248.data._M_elems._32_5_;
  local_208.exp = local_248.exp;
  local_208.neg = local_248.neg;
  local_208.fpclass = local_248.fpclass;
  local_208.prec_elem = local_248.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_208,&local_a8);
  uVar10 = local_208._48_8_;
  bVar9 = local_208.neg;
  iVar13 = local_208.exp;
  local_128[0] = local_208.data._M_elems[0];
  local_128[1] = local_208.data._M_elems[1];
  auStack_120[0] = local_208.data._M_elems[2];
  auStack_120[1] = local_208.data._M_elems[3];
  local_118[0] = local_208.data._M_elems[4];
  local_118[1] = local_208.data._M_elems[5];
  auStack_110[0] = local_208.data._M_elems[6];
  auStack_110[1] = local_208.data._M_elems[7];
  local_108[0] = local_208.data._M_elems[8];
  local_108[1] = local_208.data._M_elems[9];
  local_f8 = local_208.fpclass;
  iStack_f4 = local_208.prec_elem;
  uStack_f0 = 0;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_e0,this);
  uVar11 = local_208._48_8_;
  local_248.data._M_elems._32_5_ = SUB85(local_108._0_8_,0);
  local_248.data._M_elems[9]._1_3_ = SUB83(local_108._0_8_,5);
  local_248.data._M_elems[4] = local_118[0];
  local_248.data._M_elems[5] = local_118[1];
  local_248.data._M_elems._24_5_ = auStack_110._0_5_;
  local_248.data._M_elems[7]._1_3_ = auStack_110[1]._1_3_;
  local_248.data._M_elems[0] = local_128[0];
  local_248.data._M_elems[1] = local_128[1];
  uVar7 = local_248.data._M_elems._0_8_;
  local_248.data._M_elems[2] = auStack_120[0];
  local_248.data._M_elems[3] = auStack_120[1];
  local_248.exp = iVar13;
  local_248.neg = bVar9;
  local_208.fpclass = (fpclass_type)uVar10;
  local_208.prec_elem = SUB84(uVar10,4);
  local_248.fpclass = local_208.fpclass;
  local_248.prec_elem = local_208.prec_elem;
  if ((bVar9 == true) &&
     (local_248.data._M_elems[0] = local_128[0],
     local_248.data._M_elems[0] != 0 || local_f8 != cpp_dec_float_finite)) {
    local_248.neg = false;
  }
  local_248.data._M_elems._0_8_ = uVar7;
  local_208._48_8_ = uVar11;
  if (((local_f8 != cpp_dec_float_NaN) && (local_e0.fpclass != cpp_dec_float_NaN)) &&
     (iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_248,&local_e0), iVar13 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_208,0.0);
  }
  local_a8.data._M_elems[0] = local_208.data._M_elems[0];
  local_a8.data._M_elems[1] = local_208.data._M_elems[1];
  local_a8.data._M_elems[2] = local_208.data._M_elems[2];
  local_a8.data._M_elems[3] = local_208.data._M_elems[3];
  local_a8.data._M_elems[4] = local_208.data._M_elems[4];
  local_a8.data._M_elems[5] = local_208.data._M_elems[5];
  local_a8.data._M_elems._24_5_ = local_208.data._M_elems._24_5_;
  local_a8.data._M_elems[7]._1_3_ = local_208.data._M_elems[7]._1_3_;
  local_a8.data._M_elems._32_5_ = local_208.data._M_elems._32_5_;
  local_a8.data._M_elems[9]._1_3_ = local_208.data._M_elems[9]._1_3_;
  local_a8.exp = local_208.exp;
  local_a8.neg = local_208.neg;
  local_a8.fpclass = local_208.fpclass;
  local_a8.prec_elem = local_208.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_a8,&local_1a8);
  local_248.fpclass = cpp_dec_float_finite;
  local_248.prec_elem = 10;
  local_248.data._M_elems[0] = 0;
  local_248.data._M_elems[1] = 0;
  local_248.data._M_elems[2] = 0;
  local_248.data._M_elems[3] = 0;
  local_248.data._M_elems[4] = 0;
  local_248.data._M_elems[5] = 0;
  local_248.data._M_elems._24_5_ = 0;
  local_248.data._M_elems[7]._1_3_ = 0;
  local_248.data._M_elems._32_5_ = 0;
  local_248.data._M_elems[9]._1_3_ = 0;
  local_248.exp = 0;
  local_248.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_248,&local_a8,&local_68);
  iVar13 = this->m_j;
  pnVar5 = (x->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar5[iVar13].m_backend.data._M_elems + 8) =
       CONCAT35(local_248.data._M_elems[9]._1_3_,local_248.data._M_elems._32_5_);
  puVar1 = pnVar5[iVar13].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_248.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_248.data._M_elems[7]._1_3_,local_248.data._M_elems._24_5_)
  ;
  *(undefined8 *)&pnVar5[iVar13].m_backend.data = local_248.data._M_elems._0_8_;
  *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 2) = local_248.data._M_elems._8_8_;
  pnVar5[iVar13].m_backend.exp = local_248.exp;
  pnVar5[iVar13].m_backend.neg = local_248.neg;
  pnVar5[iVar13].m_backend.fpclass = local_248.fpclass;
  pnVar5[iVar13].m_backend.prec_elem = local_248.prec_elem;
  iVar13 = this->m_i;
  pnVar5 = (local_1c8->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 8) =
       *(undefined8 *)((local_1d0->m_backend).data._M_elems + 8);
  uVar7 = *(undefined8 *)(local_1d0->m_backend).data._M_elems;
  uVar10 = *(undefined8 *)((local_1d0->m_backend).data._M_elems + 2);
  uVar11 = *(undefined8 *)((local_1d0->m_backend).data._M_elems + 6);
  puVar1 = pnVar5[iVar13].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = *(undefined8 *)((local_1d0->m_backend).data._M_elems + 4);
  *(undefined8 *)(puVar1 + 2) = uVar11;
  *(undefined8 *)&pnVar5[iVar13].m_backend.data = uVar7;
  *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 2) = uVar10;
  pnVar5[iVar13].m_backend.exp = (this->m_lRhs).m_backend.exp;
  pnVar5[iVar13].m_backend.neg = (this->m_lRhs).m_backend.neg;
  iVar12 = (this->m_lRhs).m_backend.prec_elem;
  pnVar5[iVar13].m_backend.fpclass = (this->m_lRhs).m_backend.fpclass;
  pnVar5[iVar13].m_backend.prec_elem = iVar12;
  local_248.fpclass = cpp_dec_float_finite;
  local_248.prec_elem = 10;
  local_248.data._M_elems[0] = 0;
  local_248.data._M_elems[1] = 0;
  local_248.data._M_elems[2] = 0;
  local_248.data._M_elems[3] = 0;
  local_248.data._M_elems[4] = 0;
  local_248.data._M_elems[5] = 0;
  local_248.data._M_elems._24_5_ = 0;
  local_248.data._M_elems[7]._1_3_ = 0;
  local_248.data._M_elems._32_5_ = 0;
  local_248.data._M_elems[9]._1_3_ = 0;
  local_248.exp = 0;
  local_248.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_248,&(this->m_obj).m_backend,&local_68);
  iVar13 = this->m_i;
  pnVar5 = (local_1c0->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar5[iVar13].m_backend.data._M_elems + 8) =
       CONCAT35(local_248.data._M_elems[9]._1_3_,local_248.data._M_elems._32_5_);
  puVar1 = pnVar5[iVar13].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = local_248.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_248.data._M_elems[7]._1_3_,local_248.data._M_elems._24_5_)
  ;
  *(undefined8 *)&pnVar5[iVar13].m_backend.data = local_248.data._M_elems._0_8_;
  *(undefined8 *)(pnVar5[iVar13].m_backend.data._M_elems + 2) = local_248.data._M_elems._8_8_;
  pnVar5[iVar13].m_backend.exp = local_248.exp;
  pnVar5[iVar13].m_backend.neg = local_248.neg;
  pnVar5[iVar13].m_backend.fpclass = local_248.fpclass;
  pnVar5[iVar13].m_backend.prec_elem = local_248.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)
             ((local_1b8->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
  local_1b0->data[this->m_j] = BASIC;
  if (this->m_eqCons == true) {
    rStatus->data[this->m_i] = FIXED;
  }
  else if (this->m_onLhs == true) {
    rStatus->data[this->m_i] = ON_LOWER;
  }
  else {
    rStatus->data[this->m_i] = ON_UPPER;
  }
  return;
}

Assistant:

void SPxMainSM<R>::FreeColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{

   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      s[m_old_i] = s[m_i];
      y[m_old_i] = y[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   // correcting the change of idx by deletion of the column:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal:
   R val = 0.0;
   R aij = m_row[m_j];

   for(int k = 0; k < m_row.size(); ++k)
   {
      if(m_row.index(k) != m_j)
         val += m_row.value(k) * x[m_row.index(k)];
   }

   R scale = maxAbs(m_lRhs, val);

   if(scale < 1.0)
      scale = 1.0;

   R z = (m_lRhs / scale) - (val / scale);

   if(isZero(z, this->epsilon()))
      z = 0.0;

   x[m_j] = z * scale / aij;
   s[m_i] = m_lRhs;

   // dual:
   y[m_i] = m_obj / aij;
   r[m_j] = 0.0;

   // basis:
   cStatus[m_j] = SPxSolverBase<R>::BASIC;

   if(m_eqCons)
      rStatus[m_i] = SPxSolverBase<R>::FIXED;
   else if(m_onLhs)
      rStatus[m_i] = SPxSolverBase<R>::ON_LOWER;
   else
      rStatus[m_i] = SPxSolverBase<R>::ON_UPPER;

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM22 Dimension doesn't match after this step.");
   }

#endif
}